

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code
llvm::sys::fs::createTemporaryFile(Twine *Prefix,StringRef Suffix,SmallVectorImpl<char> *ResultPath)

{
  bool bVar1;
  SmallVectorImpl<char> *in_R9;
  error_code eVar2;
  StringRef Suffix_00;
  int local_3c;
  SmallVectorImpl<char> *pSStack_38;
  int FD;
  SmallVectorImpl<char> *ResultPath_local;
  Twine *Prefix_local;
  StringRef Suffix_local;
  error_code EC;
  
  Suffix_00.Data = (char *)Suffix.Length;
  Prefix_local = (Twine *)Suffix.Data;
  Suffix_00.Length = (size_t)&local_3c;
  pSStack_38 = ResultPath;
  ResultPath_local = (SmallVectorImpl<char> *)Prefix;
  Suffix_local.Data = Suffix_00.Data;
  eVar2 = createTemporaryFile((fs *)Prefix,Prefix_local,Suffix_00,(int *)ResultPath,in_R9);
  Suffix_local.Length._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&Suffix_local.Length);
  if (!bVar1) {
    close(local_3c);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)Suffix_local.Length;
  return eVar2;
}

Assistant:

std::error_code createTemporaryFile(const Twine &Prefix, StringRef Suffix,
                                    SmallVectorImpl<char> &ResultPath) {
  int FD;
  auto EC = createTemporaryFile(Prefix, Suffix, FD, ResultPath);
  if (EC)
    return EC;
  // FD is only needed to avoid race conditions. Close it right away.
  close(FD);
  return EC;
}